

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int initScan(ENCODING **encodingTable,INIT_ENCODING *enc,int state,char *ptr,char *end,
            char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  ENCODING **ppEVar3;
  ushort uVar4;
  int iVar5;
  int e;
  ENCODING **encPtr;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  int state_local;
  INIT_ENCODING *enc_local;
  ENCODING **encodingTable_local;
  
  if (end <= ptr) {
    return -4;
  }
  ppEVar3 = enc->encPtr;
  if (ptr + 1 == end) {
    if ((int)(enc->initEnc).isUtf16 - 3U < 3) {
      return -1;
    }
    bVar1 = *ptr;
    if (((bVar1 == 0) || (bVar1 == 0x3c)) ||
       (((bVar1 == 0xef || (0xfd < bVar1)) && (((enc->initEnc).isUtf16 != '\0' || (state != 1))))))
    {
      return -1;
    }
  }
  else {
    uVar4 = *(ushort *)ptr << 8 | *(ushort *)ptr >> 8;
    if (uVar4 == 0x3c00) {
      if ((((enc->initEnc).isUtf16 != '\x04') && ((enc->initEnc).isUtf16 != '\x03')) || (state != 1)
         ) {
        *ppEVar3 = encodingTable[5];
        iVar5 = (*(*ppEVar3)->scanners[state])(*ppEVar3,ptr,end,nextTokPtr);
        return iVar5;
      }
    }
    else if (uVar4 == 0xefbb) {
      if ((state != 1) ||
         (((cVar2 = (enc->initEnc).isUtf16, cVar2 != '\0' && (cVar2 != '\x04')) &&
          ((cVar2 != '\x05' && (cVar2 != '\x03')))))) {
        if (ptr + 2 == end) {
          return -1;
        }
        if (ptr[2] == -0x41) {
          *nextTokPtr = ptr + 3;
          *ppEVar3 = encodingTable[2];
          return 0xe;
        }
      }
    }
    else if (uVar4 == 0xfeff) {
      if (((enc->initEnc).isUtf16 != '\0') || (state != 1)) {
        *nextTokPtr = ptr + 2;
        *ppEVar3 = encodingTable[4];
        return 0xe;
      }
    }
    else if (uVar4 == 0xfffe) {
      if (((enc->initEnc).isUtf16 != '\0') || (state != 1)) {
        *nextTokPtr = ptr + 2;
        *ppEVar3 = encodingTable[5];
        return 0xe;
      }
    }
    else if (*ptr == '\0') {
      if ((state != 1) || ((enc->initEnc).isUtf16 != '\x05')) {
        *ppEVar3 = encodingTable[4];
        iVar5 = (*(*ppEVar3)->scanners[state])(*ppEVar3,ptr,end,nextTokPtr);
        return iVar5;
      }
    }
    else if ((ptr[1] == '\0') && (state != 1)) {
      *ppEVar3 = encodingTable[5];
      iVar5 = (*(*ppEVar3)->scanners[state])(*ppEVar3,ptr,end,nextTokPtr);
      return iVar5;
    }
  }
  *ppEVar3 = encodingTable[(int)(enc->initEnc).isUtf16];
  iVar5 = (*(*ppEVar3)->scanners[state])(*ppEVar3,ptr,end,nextTokPtr);
  return iVar5;
}

Assistant:

static int
initScan(const ENCODING *const *encodingTable, const INIT_ENCODING *enc,
         int state, const char *ptr, const char *end, const char **nextTokPtr) {
  const ENCODING **encPtr;

  if (ptr >= end)
    return XML_TOK_NONE;
  encPtr = enc->encPtr;
  if (ptr + 1 == end) {
    /* only a single byte available for auto-detection */
#ifndef XML_DTD /* FIXME */
    /* a well-formed document entity must have more than one byte */
    if (state != XML_CONTENT_STATE)
      return XML_TOK_PARTIAL;
#endif
    /* so we're parsing an external text entity... */
    /* if UTF-16 was externally specified, then we need at least 2 bytes */
    switch (INIT_ENC_INDEX(enc)) {
    case UTF_16_ENC:
    case UTF_16LE_ENC:
    case UTF_16BE_ENC:
      return XML_TOK_PARTIAL;
    }
    switch ((unsigned char)*ptr) {
    case 0xFE:
    case 0xFF:
    case 0xEF: /* possibly first byte of UTF-8 BOM */
      if (INIT_ENC_INDEX(enc) == ISO_8859_1_ENC && state == XML_CONTENT_STATE)
        break;
      /* fall through */
    case 0x00:
    case 0x3C:
      return XML_TOK_PARTIAL;
    }
  } else {
    switch (((unsigned char)ptr[0] << 8) | (unsigned char)ptr[1]) {
    case 0xFEFF:
      if (INIT_ENC_INDEX(enc) == ISO_8859_1_ENC && state == XML_CONTENT_STATE)
        break;
      *nextTokPtr = ptr + 2;
      *encPtr = encodingTable[UTF_16BE_ENC];
      return XML_TOK_BOM;
    /* 00 3C is handled in the default case */
    case 0x3C00:
      if ((INIT_ENC_INDEX(enc) == UTF_16BE_ENC
           || INIT_ENC_INDEX(enc) == UTF_16_ENC)
          && state == XML_CONTENT_STATE)
        break;
      *encPtr = encodingTable[UTF_16LE_ENC];
      return XmlTok(*encPtr, state, ptr, end, nextTokPtr);
    case 0xFFFE:
      if (INIT_ENC_INDEX(enc) == ISO_8859_1_ENC && state == XML_CONTENT_STATE)
        break;
      *nextTokPtr = ptr + 2;
      *encPtr = encodingTable[UTF_16LE_ENC];
      return XML_TOK_BOM;
    case 0xEFBB:
      /* Maybe a UTF-8 BOM (EF BB BF) */
      /* If there's an explicitly specified (external) encoding
         of ISO-8859-1 or some flavour of UTF-16
         and this is an external text entity,
         don't look for the BOM,
         because it might be a legal data.
      */
      if (state == XML_CONTENT_STATE) {
        int e = INIT_ENC_INDEX(enc);
        if (e == ISO_8859_1_ENC || e == UTF_16BE_ENC || e == UTF_16LE_ENC
            || e == UTF_16_ENC)
          break;
      }
      if (ptr + 2 == end)
        return XML_TOK_PARTIAL;
      if ((unsigned char)ptr[2] == 0xBF) {
        *nextTokPtr = ptr + 3;
        *encPtr = encodingTable[UTF_8_ENC];
        return XML_TOK_BOM;
      }
      break;
    default:
      if (ptr[0] == '\0') {
        /* 0 isn't a legal data character. Furthermore a document
           entity can only start with ASCII characters.  So the only
           way this can fail to be big-endian UTF-16 if it it's an
           external parsed general entity that's labelled as
           UTF-16LE.
        */
        if (state == XML_CONTENT_STATE && INIT_ENC_INDEX(enc) == UTF_16LE_ENC)
          break;
        *encPtr = encodingTable[UTF_16BE_ENC];
        return XmlTok(*encPtr, state, ptr, end, nextTokPtr);
      } else if (ptr[1] == '\0') {
        /* We could recover here in the case:
            - parsing an external entity
            - second byte is 0
            - no externally specified encoding
            - no encoding declaration
           by assuming UTF-16LE.  But we don't, because this would mean when
           presented just with a single byte, we couldn't reliably determine
           whether we needed further bytes.
        */
        if (state == XML_CONTENT_STATE)
          break;
        *encPtr = encodingTable[UTF_16LE_ENC];
        return XmlTok(*encPtr, state, ptr, end, nextTokPtr);
      }
      break;
    }
  }
  *encPtr = encodingTable[INIT_ENC_INDEX(enc)];
  return XmlTok(*encPtr, state, ptr, end, nextTokPtr);
}